

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV2LightSettingsBlock(Parser *this,Light *light)

{
  bool bVar1;
  int local_1c;
  int iDepth;
  Light *light_local;
  Parser *this_local;
  
  local_1c = 0;
  do {
    while (*this->filePtr != '*') {
LAB_0049290f:
      if (*this->filePtr == '{') {
        local_1c = local_1c + 1;
      }
      else if (*this->filePtr == '}') {
        local_1c = local_1c + -1;
        if (local_1c == 0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        LogError(this,"Encountered unexpected EOL while parsing a LIGHT_SETTINGS chunk (Level 2)");
      }
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"LIGHT_COLOR",0xb);
    if (bVar1) {
      ParseLV4MeshFloatTriple(this,&(light->mColor).r);
    }
    else {
      bVar1 = TokenMatch<char_const>(&this->filePtr,"LIGHT_INTENS",0xc);
      if (bVar1) {
        ParseLV4MeshFloat(this,&light->mIntensity);
      }
      else {
        bVar1 = TokenMatch<char_const>(&this->filePtr,"LIGHT_HOTSPOT",0xd);
        if (bVar1) {
          ParseLV4MeshFloat(this,&light->mAngle);
        }
        else {
          bVar1 = TokenMatch<char_const>(&this->filePtr,"LIGHT_FALLOFF",0xd);
          if (!bVar1) goto LAB_0049290f;
          ParseLV4MeshFloat(this,&light->mFalloff);
        }
      }
    }
  } while( true );
}

Assistant:

void Parser::ParseLV2LightSettingsBlock(ASE::Light& light)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"LIGHT_COLOR" ,11))
            {
                ParseLV4MeshFloatTriple(&light.mColor.r);
                continue;
            }
            if (TokenMatch(filePtr,"LIGHT_INTENS" ,12))
            {
                ParseLV4MeshFloat(light.mIntensity);
                continue;
            }
            if (TokenMatch(filePtr,"LIGHT_HOTSPOT" ,13))
            {
                ParseLV4MeshFloat(light.mAngle);
                continue;
            }
            if (TokenMatch(filePtr,"LIGHT_FALLOFF" ,13))
            {
                ParseLV4MeshFloat(light.mFalloff);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","LIGHT_SETTINGS");
    }
    return;
}